

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

external_size_type __thiscall foxxll::config::total_size(config *this)

{
  bool bVar1;
  pointer pdVar2;
  __normal_iterator<const_foxxll::disk_config_*,_std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>_>
  local_28;
  __normal_iterator<const_foxxll::disk_config_*,_std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>_>
  local_20;
  const_iterator it;
  external_size_type total_size;
  config *this_local;
  
  if ((this->is_initialized & 1U) != 0) {
    it._M_current = (disk_config *)0x0;
    local_20._M_current =
         (disk_config *)
         std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>::begin
                   (&this->disks_list);
    while( true ) {
      local_28._M_current =
           (disk_config *)
           std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>::end
                     (&this->disks_list);
      bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
      if (!bVar1) break;
      pdVar2 = __gnu_cxx::
               __normal_iterator<const_foxxll::disk_config_*,_std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>_>
               ::operator->(&local_20);
      it._M_current = (disk_config *)(&((it._M_current)->path)._M_dataplus + pdVar2->size);
      __gnu_cxx::
      __normal_iterator<const_foxxll::disk_config_*,_std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>_>
      ::operator++(&local_20,0);
    }
    return (external_size_type)it._M_current;
  }
  __assert_fail("is_initialized",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stxxl[P]foxxll/foxxll/mng/config.cpp"
                ,0x113,"external_size_type foxxll::config::total_size() const");
}

Assistant:

external_size_type config::total_size() const
{
    assert(is_initialized);

    external_size_type total_size = 0;

    for (disk_list_type::const_iterator it = disks_list.begin();
         it != disks_list.end(); it++)
    {
        total_size += it->size;
    }

    return total_size;
}